

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_id.h
# Opt level: O0

int libyuv::TestCpuFlag(int test_flag)

{
  uint in_EDI;
  int cpu_info;
  undefined4 local_10;
  
  if (cpu_info_ == 0) {
    local_10 = InitCpuFlags();
  }
  else {
    local_10 = cpu_info_;
  }
  return local_10 & in_EDI;
}

Assistant:

static __inline int TestCpuFlag(int test_flag) {
  LIBYUV_API extern int cpu_info_;
#ifdef __ATOMIC_RELAXED
  int cpu_info = __atomic_load_n(&cpu_info_, __ATOMIC_RELAXED);
#else
  int cpu_info = cpu_info_;
#endif
  return (!cpu_info ? InitCpuFlags() : cpu_info) & test_flag;
}